

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::ResetRenderTargets
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  ITextureView *pIVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  RefCntAutoPtr<Diligent::TextureViewVkImpl> *this_00;
  ulong uVar5;
  string msg;
  string local_50;
  
  uVar2 = (ulong)this->m_NumBoundRenderTargets;
  if (this->m_NumBoundRenderTargets != 0) {
    this_00 = this->m_pBoundRenderTargets;
    uVar5 = 0;
    do {
      RefCntAutoPtr<Diligent::TextureViewVkImpl>::Release(this_00);
      uVar5 = uVar5 + 1;
      uVar2 = (ulong)this->m_NumBoundRenderTargets;
      this_00 = this_00 + 1;
    } while (uVar5 < uVar2);
  }
  if ((uint)uVar2 < 8) {
    lVar4 = uVar2 + 0x9b;
    do {
      if (*(long *)((long)this->m_VertexStreams + lVar4 * 8 + -0x18) != 0) {
        FormatString<char[29]>(&local_50,(char (*) [29])"Non-null render target found");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"ResetRenderTargets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x5a2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      iVar3 = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (iVar3 != 0xa2);
  }
  this->m_DvpRenderTargetFormatsHash = 0;
  this->m_NumBoundRenderTargets = 0;
  this->m_FramebufferWidth = 0;
  this->m_FramebufferHeight = 0;
  this->m_FramebufferSlices = 0;
  this->m_FramebufferSamples = 0;
  RefCntAutoPtr<Diligent::TextureViewVkImpl>::Release(&this->m_pBoundDepthStencil);
  pIVar1 = (this->m_pBoundShadingRateMap).m_pObject;
  if (pIVar1 != (ITextureView *)0x0) {
    (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[2])();
    (this->m_pBoundShadingRateMap).m_pObject = (ITextureView *)0x0;
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::ResetRenderTargets()
{
    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
        m_pBoundRenderTargets[rt].Release();
#ifdef DILIGENT_DEBUG
    for (Uint32 rt = m_NumBoundRenderTargets; rt < _countof(m_pBoundRenderTargets); ++rt)
    {
        VERIFY(m_pBoundRenderTargets[rt] == nullptr, "Non-null render target found");
    }
#endif
    m_NumBoundRenderTargets = 0;
    m_FramebufferWidth      = 0;
    m_FramebufferHeight     = 0;
    m_FramebufferSlices     = 0;
    m_FramebufferSamples    = 0;
#ifdef DILIGENT_DEVELOPMENT
    m_DvpRenderTargetFormatsHash = 0;
#endif

    m_pBoundDepthStencil.Release();
    m_pBoundShadingRateMap.Release();

    // Do not reset framebuffer here as there may potentially
    // be a subpass without any render target attachments.
}